

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

size_t anon_unknown.dwarf_c91149::memory_consumed
                 (vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *csts)

{
  const_iterator cVar1;
  const_iterator cVar2;
  unsigned_long uVar3;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *csts_local;
  
  cVar1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cbegin(csts);
  cVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::cend(csts);
  uVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<baryonyx::constraint_const*,std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>,unsigned_long,(anonymous_namespace)::memory_consumed(std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>const&)::__0>
                    (cVar1._M_current,cVar2._M_current,0);
  return uVar3;
}

Assistant:

static std::size_t
memory_consumed(const std::vector<baryonyx::constraint>& csts) noexcept
{
    return std::accumulate(csts.cbegin(),
                           csts.cend(),
                           static_cast<std::size_t>(0),
                           [](std::size_t size, const auto& elem) {
                               return size + memory_consumed(elem);
                           });
}